

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Process.cpp
# Opt level: O2

int __thiscall Process::open(Process *this,char *__file,int __oflag,...)

{
  long lVar1;
  undefined1 auVar2 [8];
  int iVar3;
  int *piVar4;
  char *pcVar5;
  ulong uVar6;
  ulong uVar7;
  Iterator IVar8;
  long lVar9;
  undefined8 uStack_d0;
  EmptyData *pEStack_c8;
  String local_c0;
  undefined1 local_98 [8];
  List<String> command;
  
  if (this->pid == 0) {
    local_98 = (undefined1  [8])&command._size;
    command._begin.item = (Item *)0x0;
    command._size = (usize)&String::emptyData;
    command.endItem.value._data.ref = 0;
    command.endItem.prev = (Item *)0x0;
    command.endItem.next = (Item *)0x0;
    command.freeItem = (Item *)0x0;
    uStack_d0 = 0x10f3f8;
    command._end.item = (Item *)local_98;
    Private::splitCommandLine((String *)__file,(List<String> *)local_98);
    if (command.endItem.value._data.ref == 0) {
      local_c0.data = &String::emptyData.super_Data;
      uStack_d0 = 0x10f415;
      List<String>::append((List<String> *)local_98,&local_c0);
      uStack_d0 = 0x10f421;
      String::~String(&local_c0);
    }
    auVar2 = local_98;
    lVar1 = -((long)command._begin.item * 8 + 0x17U & 0xfffffffffffffff0);
    lVar9 = (long)&pEStack_c8 + lVar1;
    uVar7 = 0;
    command.blocks._4_4_ = __oflag;
    for (IVar8.item = command._end.item; (undefined1  [8])IVar8.item != auVar2;
        IVar8.item = (IVar8.item)->next) {
      *(undefined8 *)((long)&uStack_d0 + lVar1) = 0x10f45c;
      pcVar5 = String::operator_cast_to_char_(&(IVar8.item)->value);
      *(char **)(lVar9 + uVar7 * 8) = pcVar5;
      uVar7 = uVar7 + 1;
    }
    *(undefined8 *)(lVar9 + (uVar7 & 0xffffffff) * 8) = 0;
    IVar8 = command._end;
    uVar6 = (ulong)command.blocks._4_4_;
    *(undefined8 *)((long)&uStack_d0 + lVar1) = 0x10f48d;
    iVar3 = open(this,(char *)IVar8.item,(int)uVar7 + 1,lVar9,uVar6);
    *(undefined8 *)((long)&uStack_d0 + lVar1) = 0x10f49b;
    List<String>::~List((List<String> *)local_98);
  }
  else {
    uStack_d0 = 0x10f3ad;
    piVar4 = __errno_location();
    *piVar4 = 0x16;
    iVar3 = 0;
  }
  return iVar3;
}

Assistant:

bool Process::open(const String& commandLine, uint streams)
{
#ifdef _WIN32
  if(hProcess != INVALID_HANDLE_VALUE)
  {
    SetLastError(ERROR_INVALID_HANDLE);
    return false;
  }

  STARTUPINFO si;
  PROCESS_INFORMATION pi;

  ZeroMemory(&si, sizeof(si));
  si.cb = sizeof(si);
  ZeroMemory(&pi, sizeof(pi));

  si.dwFlags = STARTF_USESTDHANDLES;
  si.hStdInput = INVALID_HANDLE_VALUE;
  si.hStdOutput = INVALID_HANDLE_VALUE;
  si.hStdError = INVALID_HANDLE_VALUE;

  SECURITY_ATTRIBUTES sa; 
  sa.nLength = sizeof(SECURITY_ATTRIBUTES); 
  sa.bInheritHandle = TRUE; 
  sa.lpSecurityDescriptor = NULL; 

  if(streams & stdoutStream)
  {
   if(!CreatePipe(&hStdOutRead, &si.hStdOutput, &sa, 0) ||
      !SetHandleInformation(hStdOutRead, HANDLE_FLAG_INHERIT, 0))
      goto error;
  }
  else
    si.hStdOutput = GetStdHandle(STD_OUTPUT_HANDLE);
  if(streams & stderrStream)
  {
   if(!CreatePipe(&hStdErrRead, &si.hStdError, &sa, 0) ||
      !SetHandleInformation(hStdErrRead, HANDLE_FLAG_INHERIT, 0))
      goto error;
  }
  else
    si.hStdError = GetStdHandle(STD_ERROR_HANDLE);
  if(streams & stdinStream)
  {
   if(!CreatePipe(&si.hStdInput, &hStdInWrite, &sa, 0) ||
      !SetHandleInformation(hStdInWrite, HANDLE_FLAG_INHERIT, 0))
      goto error;
  }
  else
    si.hStdInput = GetStdHandle(STD_INPUT_HANDLE);

  {
    String args(commandLine);

    if(!CreateProcess(NULL, (char*)args, NULL, NULL, TRUE, 0, NULL, NULL, &si, &pi))
      goto error;
  }

  CloseHandle(pi.hThread);

  if(streams & stdoutStream && si.hStdOutput != INVALID_HANDLE_VALUE)
    CloseHandle(si.hStdOutput);
  if(streams & stderrStream && si.hStdError != INVALID_HANDLE_VALUE)
    CloseHandle(si.hStdError);
  if(streams & stdinStream && si.hStdInput != INVALID_HANDLE_VALUE)
    CloseHandle(si.hStdInput);

  ASSERT(pi.hProcess);
  hProcess = pi.hProcess;
  pid = pi.dwProcessId;
  return true;
error:
  DWORD err = GetLastError();
  if(hStdOutRead != INVALID_HANDLE_VALUE)
  {
    CloseHandle(hStdOutRead);
    hStdOutRead = INVALID_HANDLE_VALUE;
  }
  if(hStdErrRead != INVALID_HANDLE_VALUE)
  {
    CloseHandle(hStdErrRead);
    hStdErrRead = INVALID_HANDLE_VALUE;
  }
  if(hStdInWrite != INVALID_HANDLE_VALUE)
  {
    CloseHandle(hStdInWrite);
    hStdInWrite = INVALID_HANDLE_VALUE;
  }
  if(streams & stdoutStream && si.hStdOutput != INVALID_HANDLE_VALUE)
    CloseHandle(si.hStdOutput);
  if(streams & stderrStream && si.hStdError != INVALID_HANDLE_VALUE)
    CloseHandle(si.hStdError);
  if(streams & stdinStream && si.hStdInput != INVALID_HANDLE_VALUE)
    CloseHandle(si.hStdInput);
  SetLastError(err);
  return false;
#else
  if(pid)
  {
    errno = EINVAL;
    return false;
  }

  List<String> command;
  Private::splitCommandLine(commandLine, command);
  if(command.isEmpty())
    command.append(String());

  char** argv = (char**)alloca(sizeof(char*) * (command.size() + 1));
  int i = 0;
  for (List<String>::Iterator j = command.begin(), end = command.end(); j != end; ++j)
    argv[i++] = (char*)(const char*)*j;
  argv[i] = 0;
  return open(command.front(), i + 1, argv, streams);
#endif
}